

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::(anonymous_namespace)::ExpandWithIndices<std::array<unsigned_int,4ul>>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
          *values,uint32_t elementSize,vector<int,_std::allocator<int>_> *indices,
          vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
          *dest)

{
  undefined8 *puVar1;
  uint uVar2;
  size_type sVar3;
  undefined8 uVar4;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RAX;
  ulong uVar5;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX;
  vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_> *pvVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_01;
  undefined4 in_register_0000000c;
  long lVar9;
  ulong *puVar10;
  long lVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> invalidIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  unexpected_type<const_char_*> local_90;
  undefined8 local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  undefined8 local_68;
  ulong local_60;
  long lStack_58;
  string local_50;
  
  plVar8 = (long *)CONCAT44(in_register_0000000c,elementSize);
  if (indices == (vector<int,_std::allocator<int>_> *)0x0) {
    local_90.m_error = "`dest` is nullptr.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,&local_90);
    return extraout_RAX;
  }
  if (*plVar8 == plVar8[1]) {
    pvVar6 = std::
             vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
             ::operator=((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                          *)indices,
                         (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                          *)this);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = true;
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)CONCAT71((int7)((ulong)pvVar6 >> 8),1);
  }
  if ((int)values == 0) {
LAB_0018d72d:
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = false;
    return in_RAX;
  }
  uVar5 = *(long *)(this + 8) - *(long *)this >> 4;
  uVar14 = (ulong)values & 0xffffffff;
  in_RAX = (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(uVar5 / uVar14);
  if (uVar5 % uVar14 != 0) goto LAB_0018d72d;
  std::vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
  resize((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_> *)
         indices,(plVar8[1] - *plVar8 >> 2) * uVar14);
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_90.m_error = (error_type)0x0;
  lVar9 = *plVar8;
  if (plVar8[1] == lVar9) {
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
  }
  else {
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
    do {
      uVar2 = *(uint *)(lVar9 + (long)local_90.m_error * 4);
      if (((int)uVar2 < 0) ||
         (uVar5 = ((ulong)uVar2 + 1) * uVar14, uVar12 = *(long *)(this + 8) - *(long *)this >> 4,
         uVar12 <= uVar5 && uVar5 - uVar12 != 0)) {
        if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a8,
                     (iterator)
                     local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_90);
        }
        else {
          *local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_90.m_error;
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      }
      else {
        lVar11 = (ulong)uVar2 * uVar14 * 0x10;
        lVar9 = (long)local_90.m_error * uVar14 * 0x10;
        uVar5 = uVar14;
        do {
          uVar4 = ((undefined8 *)(*(long *)this + lVar11))[1];
          puVar1 = (undefined8 *)
                   ((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar9);
          *puVar1 = *(undefined8 *)(*(long *)this + lVar11);
          puVar1[1] = uVar4;
          lVar11 = lVar11 + 0x10;
          lVar9 = lVar9 + 0x10;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      local_90.m_error = local_90.m_error + 1;
      lVar9 = *plVar8;
    } while (local_90.m_error < (ulong *)(plVar8[1] - lVar9 >> 2));
    if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      tinyusdz::value::print_array_snipped<unsigned_long>(&local_50,&local_a8,5);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x24f7ce);
      local_70 = &local_60;
      puVar13 = (ulong *)(plVar8 + 2);
      if ((ulong *)*plVar8 == puVar13) {
        local_60 = *puVar13;
        lStack_58 = plVar8[3];
        puVar10 = local_70;
      }
      else {
        local_60 = *puVar13;
        puVar10 = (ulong *)*plVar8;
      }
      local_80 = local_60;
      sVar3 = plVar8[1];
      *plVar8 = (long)puVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      local_90.m_error = (error_type)&local_80;
      if (puVar10 == local_70) {
        lStack_78 = lStack_58;
        puVar10 = (ulong *)local_90.m_error;
      }
      local_68 = 0;
      local_60 = local_60 & 0xffffffffffffff00;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = false;
      puVar13 = (ulong *)((long)&(__return_storage_ptr__->contained).
                                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 .field_0 + 0x10);
      *(ulong **)
       &(__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0 = puVar13;
      if (puVar10 == (ulong *)local_90.m_error) {
        *puVar13 = local_80;
        *(long *)((long)&(__return_storage_ptr__->contained).
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0 + 0x18) = lStack_78;
      }
      else {
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_error._M_dataplus._M_p = (pointer)puVar10;
        *(ulong *)((long)&(__return_storage_ptr__->contained).
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0 + 0x10) = local_80;
      }
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_string_length = sVar3;
      local_88 = 0;
      local_80 = local_80 & 0xffffffffffffff00;
      paVar7 = &local_50.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar7) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        paVar7 = extraout_RAX_00;
      }
      goto LAB_0018d961;
    }
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value = SUB81(paVar7,0);
LAB_0018d961:
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == (unsigned_long *)0x0) {
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)paVar7;
  }
  operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return extraout_RAX_01;
}

Assistant:

nonstd::expected<bool, std::string> ExpandWithIndices(
    const std::vector<T> &values, uint32_t elementSize, const std::vector<int32_t> &indices,
    std::vector<T> *dest) {
  if (!dest) {
    return nonstd::make_unexpected("`dest` is nullptr.");
  }

  if (indices.empty()) {
    (*dest) = values;
    return true;
  }

  if (elementSize == 0) {
    return false;
  }

  if ((values.size() % elementSize) != 0) {
    return false;
  }

  dest->resize(indices.size() * elementSize);

  std::vector<size_t> invalidIndices;

  bool valid = true;
  for (size_t i = 0; i < indices.size(); i++) {
    int32_t idx = indices[i];
    if ((idx >= 0) && ((size_t(idx+1) * size_t(elementSize)) <= values.size())) {
      for (size_t k = 0; k < elementSize; k++) {
        (*dest)[i*elementSize + k] = values[size_t(idx)*elementSize + k];
      }
    } else {
      invalidIndices.push_back(i);
      valid = false;
    }
  }

  if (invalidIndices.size()) {
    return nonstd::make_unexpected(
        "Invalid indices found: " +
        value::print_array_snipped(invalidIndices,
                                   /* N to display */ 5));
  }

  return valid;
}